

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_1c6f4d9::DirectoryObject::DumpInstallerPath
          (Value *__return_storage_ptr__,DirectoryObject *this,string *top,string *fromPathIn,
          string *toPath)

{
  char *__n1;
  int iVar1;
  long lVar2;
  Value *pVVar3;
  Value *extraout_RAX;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string fromPath;
  undefined1 local_68 [32];
  ValueHolder local_48;
  Value *local_40;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  cmSystemTools::RelativeIfUnder((string *)local_68,(string *)this,top);
  lVar2 = std::__cxx11::string::find((char)fromPathIn,0x2f);
  if (lVar2 == -1) {
    __n1 = (char *)fromPathIn->_M_string_length;
    local_48.string_ = (char *)local_68._8_8_;
    local_40 = (Value *)local_68._0_8_;
    if (__n1 <= (ulong)local_68._8_8_) {
      __str._M_str = (fromPathIn->_M_dataplus)._M_p;
      __str._M_len = (size_t)__n1;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_48,
                         local_68._8_8_ - (long)__n1,(size_type)__n1,__str);
      if (iVar1 == 0) {
        if (((char *)local_68._8_8_ == (char *)fromPathIn->_M_string_length) ||
           (((char *)(local_68._8_8_ + local_68._0_8_))[~(ulong)fromPathIn->_M_string_length] == '/'
           )) {
          Json::Value::Value((Value *)&local_48,(String *)local_68);
          Json::Value::operator=(__return_storage_ptr__,(Value *)&local_48);
          goto LAB_0048631d;
        }
      }
    }
  }
  Json::Value::Value((Value *)&local_48,objectValue);
  Json::Value::operator=(__return_storage_ptr__,(Value *)&local_48);
  Json::Value::~Value((Value *)&local_48);
  Json::Value::Value((Value *)&local_48,(String *)local_68);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"from");
  Json::Value::operator=(pVVar3,(Value *)&local_48);
  Json::Value::~Value((Value *)&local_48);
  Json::Value::Value((Value *)&local_48,fromPathIn);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"to");
  Json::Value::operator=(pVVar3,(Value *)&local_48);
LAB_0048631d:
  Json::Value::~Value((Value *)&local_48);
  pVVar3 = (Value *)(local_68 + 0x10);
  if ((Value *)local_68._0_8_ != pVVar3) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    pVVar3 = extraout_RAX;
  }
  return pVVar3;
}

Assistant:

Json::Value DirectoryObject::DumpInstallerPath(std::string const& top,
                                               std::string const& fromPathIn,
                                               std::string const& toPath)
{
  Json::Value installPath;

  std::string fromPath = RelativeIfUnder(top, fromPathIn);

  // If toPath is the last component of fromPath, use just fromPath.
  if (toPath.find_first_of('/') == std::string::npos &&
      cmHasSuffix(fromPath, toPath) &&
      (fromPath.size() == toPath.size() ||
       fromPath[fromPath.size() - toPath.size() - 1] == '/')) {
    installPath = fromPath;
  } else {
    installPath = Json::objectValue;
    installPath["from"] = fromPath;
    installPath["to"] = toPath;
  }

  return installPath;
}